

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

bool flatbuffers::VerifySizePrefixed
               (Schema *schema,Object *root,uint8_t *buf,size_t length,uoffset_t max_depth,
               uoffset_t max_tables)

{
  bool bVar1;
  Verifier v;
  
  VerifierTemplate<false>::VerifierTemplate(&v,buf,length,max_depth,max_tables,true);
  bVar1 = anon_unknown_94::VerifyObject
                    (&v,schema,root,(Table *)(buf + (ulong)*(uint *)(buf + 4) + 4),true);
  return bVar1;
}

Assistant:

bool VerifySizePrefixed(const reflection::Schema &schema,
                        const reflection::Object &root,
                        const uint8_t *const buf, const size_t length,
                        const uoffset_t max_depth, const uoffset_t max_tables) {
  Verifier v(buf, length, max_depth, max_tables);
  return VerifyObject(v, schema, root, flatbuffers::GetAnySizePrefixedRoot(buf),
                      /*required=*/true);
}